

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O3

SearchResult __thiscall
anon_unknown.dwarf_26c0fd::CliqueRunner::expand<false>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<false,_const_SVOBitset_&,_int> a,int spacepos)

{
  pointer *ppiVar1;
  ulong *puVar2;
  pointer plVar3;
  Incumbent *this_00;
  size_t *psVar4;
  ColourClassOrder CVar5;
  size_t sVar6;
  pointer plVar7;
  pointer piVar8;
  pointer piVar9;
  Proof *pPVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  SearchResult SVar14;
  uint uVar15;
  void *pvVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  int *piVar18;
  _List_node_base *p_Var19;
  SVOBitset *pSVar20;
  CliqueParams *pCVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  undefined8 uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  iterator iVar29;
  int v_1;
  ulong uVar30;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
  unaff_RBP;
  _Self __tmp_1;
  pointer plVar31;
  SVOBitset *pSVar32;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  ulong uVar33;
  int *piVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  int in_stack_fffffffffffffde8;
  uint local_208;
  int local_204;
  ulong local_200;
  ulong local_1f8;
  int *local_1f0;
  int *local_1e8;
  ulong local_1e0;
  int *local_1d8;
  unsigned_long_long *local_1d0;
  unsigned_long_long *local_1c8;
  vector<int,_std::allocator<int>_> p_order_prelim;
  vector<int,_std::allocator<int>_> colour_sizes;
  SVOBitset p_left;
  anon_union_128_2_84168a9f_for__data local_f8;
  uint local_78;
  vector<int,_std::allocator<int>_> sorted_order;
  vector<int,_std::allocator<int>_> colour_start;
  
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  piVar18 = this->space;
  iVar13 = this->size;
  local_208 = 0;
  local_1f0 = piVar18 + a;
  local_1e8 = piVar18 + (a + iVar13);
  CVar5 = this->params->colour_class_order;
  local_1d0 = find_nodes;
  local_1c8 = prove_nodes;
  if (CVar5 == Sorted) {
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    local_208 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&p_order_prelim,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_sizes,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_start,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_order,(long)this->size,(allocator_type *)&local_f8);
    unaff_RBP._M_comp.colour_sizes = (anon_class_8_1_b323165d)&p_left;
    bVar12 = gss::innards::SVOBitset::any((SVOBitset *)unaff_RBP._M_comp.colour_sizes);
    if (bVar12) {
      uVar27 = 1;
      lVar26 = 0;
      uVar15 = 0;
      do {
        local_1f8 = CONCAT44(local_1f8._4_4_,uVar15);
        colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar15] = (int)lVar26;
        colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar15] = 0;
        local_78 = p_left.n_words;
        local_200 = uVar27;
        if ((ulong)p_left.n_words < 0x11) {
          auVar36._8_8_ = p_left._data.short_data[1];
          auVar36._0_8_ = p_left._data.short_data[0];
          auVar36._16_8_ = p_left._data.short_data[2];
          auVar36._24_40_ = p_left._data._24_40_;
          auVar35 = vmovdqu64_avx512f(auVar36);
          auVar36 = vmovdqu64_avx512f(p_left._data._64_64_);
          local_f8._64_64_ = vmovdqu64_avx512f(auVar36);
          local_f8._0_64_ = vmovdqu64_avx512f(auVar35);
        }
        else {
          uVar27 = (ulong)p_left.n_words << 3;
          pvVar16 = operator_new__(uVar27);
          local_f8.long_data = (BitWord *)pvVar16;
          memmove(pvVar16,p_left._data.long_data,uVar27);
        }
        bVar12 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
        if (bVar12) {
          lVar26 = (long)(int)lVar26;
          do {
            uVar11 = local_78;
            uVar27 = (ulong)local_78;
            uVar25 = (SVOBitset *)&local_f8;
            if (0x10 < uVar27) {
              uVar25 = local_f8.short_data[0];
            }
            iVar13 = -1;
            if (uVar27 != 0) {
              lVar28 = 0;
LAB_00156cd0:
              uVar30 = (((SVOBitset *)uVar25)->_data).short_data[0];
              if (uVar30 == 0) goto code_r0x00156cd8;
              iVar13 = 0;
              for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                iVar13 = iVar13 + 1;
              }
              iVar13 = iVar13 - (int)lVar28;
            }
LAB_00156cf2:
            uVar25 = unaff_RBP._M_comp.colour_sizes;
            if (0x10 < p_left.n_words) {
              uVar25 = p_left._data.short_data[0];
            }
            bVar22 = (byte)iVar13 & 0x3f;
            uVar27 = -2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22;
            iVar24 = iVar13 + 0x3f;
            if (-1 < iVar13) {
              iVar24 = iVar13;
            }
            puVar2 = (ulong *)((long)(((SVOBitset *)uVar25)->_data).short_data +
                              (long)(iVar24 >> 6) * 8);
            *puVar2 = *puVar2 & uVar27;
            uVar25 = (SVOBitset *)&local_f8;
            if (0x10 < uVar11) {
              uVar25 = local_f8.short_data[0];
            }
            puVar2 = (ulong *)((long)(((SVOBitset *)uVar25)->_data).short_data +
                              (long)(iVar24 >> 6) * 8);
            *puVar2 = *puVar2 & uVar27;
            gss::innards::SVOBitset::intersect_with_complement
                      ((SVOBitset *)&local_f8,
                       (this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar13);
            *(int *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + lVar26 * 4) = iVar13;
            lVar26 = lVar26 + 1;
            colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] =
                 colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15] + 1;
            bVar12 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
          } while (bVar12);
        }
        iVar13 = (int)local_1f8;
        if ((0x10 < local_78) && ((void *)local_f8.short_data[0] != (void *)0x0)) {
          operator_delete__(local_f8.long_data);
        }
        uVar15 = iVar13 + 1;
        bVar12 = gss::innards::SVOBitset::any((SVOBitset *)unaff_RBP._M_comp.colour_sizes);
        piVar8 = sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar27 = (ulong)((int)local_200 + 1);
      } while (bVar12);
      local_208 = (uint)lVar26;
      if (uVar15 == 0) goto LAB_00156ed2;
      local_1f8 = (ulong)uVar15;
      auVar35 = vpmovsxbd_avx512f(_DAT_001aac50);
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar38 = vpbroadcastd_avx512f(ZEXT416(0x10));
      unaff_RBP._M_comp.colour_sizes = (anon_class_8_1_b323165d)(ulong)uVar15;
      uVar30 = local_200 & 0xffffffff;
      _Var17._M_current =
           sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + local_1f8;
      uVar27 = 0;
      auVar39 = vpbroadcastq_avx512f();
      do {
        auVar40 = vpbroadcastq_avx512f();
        auVar41 = vporq_avx512f(auVar40,auVar36);
        auVar40 = vporq_avx512f(auVar40,auVar37);
        vpcmpuq_avx512f(auVar40,auVar39,2);
        vpcmpuq_avx512f(auVar41,auVar39,2);
        auVar40 = vmovdqu32_avx512f(auVar35);
        *(undefined1 (*) [64])
         (sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start + uVar27) = auVar40;
        uVar27 = uVar27 + 0x10;
        auVar35 = vpaddd_avx512f(auVar35,auVar38);
      } while (((uVar30 * 4 - 4 >> 2) + 0x10 & 0xfffffffffffffff0) != uVar27);
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_Var17,
                 (ulong)(uint)((int)LZCOUNT(local_1f8) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                  )&colour_sizes);
      if (uVar15 < 0x11) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,_Var17,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                    )&colour_sizes);
      }
      else {
        _Var17._M_current = piVar8 + 0x10;
        unaff_RBP._M_comp.colour_sizes = (anon_class_8_1_b323165d)&colour_sizes;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,_Var17,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                    )unaff_RBP._M_comp.colour_sizes);
        lVar26 = uVar30 * 4 + -0x40;
        do {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                    (_Var17,unaff_RBP);
          _Var17._M_current = _Var17._M_current + 1;
          lVar26 = lVar26 + -4;
        } while (lVar26 != 0);
      }
      uVar27 = 0;
      iVar13 = 0;
      do {
        if (0 < colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar27]]) {
          iVar24 = colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar27]];
          lVar26 = 0;
          do {
            local_1e8[iVar13 + lVar26] = (int)uVar27 + 1;
            local_1f0[iVar13 + lVar26] =
                 *(int *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) +
                          (long)iVar24 * 4 + lVar26 * 4);
            unaff_RBP._M_comp.colour_sizes =
                 (anon_class_8_1_b323165d)
                 ((long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar27]] +
                 (long)colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar27]]);
            lVar28 = (long)iVar24 + 1 + lVar26;
            lVar26 = lVar26 + 1;
          } while (lVar28 < (long)unaff_RBP._M_comp.colour_sizes);
          iVar13 = iVar13 + (int)lVar26;
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != local_1f8);
LAB_00156f8b:
      operator_delete(sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    else {
LAB_00156ed2:
      if (sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) goto LAB_00156f8b;
    }
    if (colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar16 = (void *)CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,(long)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar16);
    }
  }
  else {
    if (CVar5 != SingletonsFirst) {
      if (CVar5 == ColourOrder) {
        colour_class_order(this,p,local_1f0,local_1e8,(int *)&local_208);
      }
      goto LAB_00157008;
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    local_208 = 0;
    bVar12 = gss::innards::SVOBitset::any(&p_left);
    if (bVar12) {
      unaff_RBP._M_comp.colour_sizes = (anon_class_8_1_b323165d)&local_f8;
      uVar27 = 0;
      local_1e0 = local_1e0 & 0xffffffff00000000;
      local_1d8 = piVar18 + (a + iVar13 * 2);
      uVar30 = 0;
      do {
        local_78 = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          auVar35._8_8_ = p_left._data.short_data[1];
          auVar35._0_8_ = p_left._data.short_data[0];
          auVar35._16_8_ = p_left._data.short_data[2];
          auVar35._24_40_ = p_left._data._24_40_;
          auVar35 = vmovdqu64_avx512f(auVar35);
          auVar36 = vmovdqu64_avx512f(p_left._data._64_64_);
          local_f8._64_64_ = vmovdqu64_avx512f(auVar36);
          local_f8._0_64_ = vmovdqu64_avx512f(auVar35);
        }
        else {
          uVar33 = (ulong)p_left.n_words << 3;
          pvVar16 = operator_new__(uVar33);
          local_f8.long_data = (BitWord *)pvVar16;
          memmove(pvVar16,p_left._data.long_data,uVar33);
        }
        uVar15 = (int)uVar30 + 1;
        bVar12 = gss::innards::SVOBitset::any((SVOBitset *)unaff_RBP._M_comp.colour_sizes);
        if (bVar12) {
          local_1f8 = CONCAT44(local_1f8._4_4_,uVar15);
          uVar27 = (long)(int)uVar27;
          iVar13 = 0;
          local_200 = uVar30;
          do {
            iVar24 = iVar13;
            uVar30 = uVar27;
            uVar15 = local_78;
            uVar27 = (ulong)local_78;
            uVar25 = unaff_RBP._M_comp.colour_sizes;
            if (0x10 < uVar27) {
              uVar25 = local_f8.short_data[0];
            }
            iVar13 = -1;
            if (uVar27 != 0) {
              lVar26 = 0;
LAB_001569c0:
              uVar33 = (((SVOBitset *)uVar25)->_data).short_data[0];
              if (uVar33 == 0) goto code_r0x001569c8;
              iVar13 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                iVar13 = iVar13 + 1;
              }
              iVar13 = iVar13 - (int)lVar26;
            }
LAB_001569e2:
            uVar25 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar25 = p_left._data.short_data[0];
            }
            bVar22 = (byte)iVar13 & 0x3f;
            uVar27 = -2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22;
            iVar23 = iVar13 + 0x3f;
            if (-1 < iVar13) {
              iVar23 = iVar13;
            }
            (((SVOBitset *)uVar25)->_data).short_data[iVar23 >> 6] =
                 (((SVOBitset *)uVar25)->_data).short_data[iVar23 >> 6] & uVar27;
            uVar25 = unaff_RBP._M_comp.colour_sizes;
            if (0x10 < uVar15) {
              uVar25 = local_f8.short_data[0];
            }
            puVar2 = (ulong *)((long)(((SVOBitset *)uVar25)->_data).short_data +
                              (long)(iVar23 >> 6) * 8);
            *puVar2 = *puVar2 & uVar27;
            gss::innards::SVOBitset::intersect_with_complement
                      ((SVOBitset *)unaff_RBP._M_comp.colour_sizes,
                       (this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar13);
            uVar27 = uVar30 + 1;
            local_1e8[uVar30] = (int)local_1f8;
            local_1f0[uVar30] = iVar13;
            bVar12 = gss::innards::SVOBitset::any((SVOBitset *)unaff_RBP._M_comp.colour_sizes);
            iVar13 = iVar24 + 1;
          } while (bVar12);
          if (iVar24 == 0) {
            uVar27 = uVar30 & 0xffffffff;
            uVar33 = local_1e0 & 0xffffffff;
            local_1e0 = CONCAT44(local_1e0._4_4_,(int)local_1e0 + 1);
            local_1d8[uVar33] = local_1f0[uVar30];
            uVar30 = local_200;
          }
          else {
            uVar30 = local_1f8 & 0xffffffff;
          }
        }
        else {
          uVar30 = (ulong)uVar15;
        }
        if ((0x10 < local_78) && ((void *)local_f8.short_data[0] != (void *)0x0)) {
          operator_delete__(local_f8.long_data);
        }
        bVar12 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar12);
      local_208 = (uint)uVar27;
      if ((int)local_1e0 != 0) {
        uVar27 = 0;
        do {
          local_1f0[(long)(int)local_208 + uVar27] = local_1d8[uVar27];
          local_1e8[(long)(int)local_208 + uVar27] = (int)uVar30 + 1 + (int)uVar27;
          uVar27 = uVar27 + 1;
        } while ((local_1e0 & 0xffffffff) != uVar27);
        local_208 = local_208 + (int)uVar27;
      }
    }
  }
  if ((0x10 < p_left.n_words) && ((void *)p_left._data.short_data[0] != (void *)0x0)) {
    operator_delete__(p_left._data.long_data);
  }
LAB_00157008:
  this_00 = &this->incumbent;
  local_204 = depth + 1;
  local_200 = (ulong)local_208;
  uVar15 = local_208;
  while( true ) {
    SVar14 = SUB84(unaff_RBP._M_comp.colour_sizes,0);
    if ((int)local_200 < 1) goto LAB_001577f5;
    bVar12 = gss::Timeout::should_abort
                       ((this->params->timeout).
                        super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar27 = local_200;
    if (bVar12) {
      return Aborted;
    }
    iVar29._M_current =
         (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    uVar30 = local_200 - 1;
    if ((ulong)(((long)iVar29._M_current -
                 (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2) + (long)local_1e8[uVar30]) <=
        (ulong)this_00->value) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        uVar30 = 0;
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        p_left._data.short_data[2] = 0;
        do {
          if ((uVar30 == 0) || (local_1e8[uVar30 - 1] != local_1e8[uVar30])) {
            if (p_left._data.short_data[1] == p_left._data.short_data[2]) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::_M_realloc_insert<>
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&p_left,(iterator)p_left._data.short_data[1]);
            }
            else {
              *(undefined8 *)(p_left._data.short_data[1] + 0x10) = 0;
              *(undefined1 (*) [16])p_left._data.short_data[1] = (undefined1  [16])0x0;
              p_left._data.short_data[1] = p_left._data.short_data[1] + 0x18;
            }
          }
          iVar29._M_current = *(int **)(p_left._data.short_data[1] - 0x10);
          piVar18 = (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + local_1f0[uVar30];
          if (iVar29._M_current == *(int **)(p_left._data.short_data[1] - 8)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)(p_left._data.short_data[1] - 0x18),iVar29
                       ,piVar18);
          }
          else {
            *iVar29._M_current = *piVar18;
            *(int **)(p_left._data.short_data[1] - 0x10) = iVar29._M_current + 1;
          }
          uVar30 = uVar30 + 1;
        } while (uVar27 != uVar30);
        gss::innards::Proof::colour_bound
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
      }
      goto LAB_001577f5;
    }
    if (local_200 == (uint)local_1e8[uVar30]) break;
    p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = local_1f0[uVar30];
    local_1e0 = uVar30;
    if (iVar29._M_current ==
        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)c,iVar29,(int *)&p_order_prelim);
    }
    else {
      *iVar29._M_current =
           (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           iVar29._M_current + 1;
    }
    pCVar21 = this->params;
    if ((pCVar21->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      bVar22 = (pCVar21->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
      if ((bool)bVar22 != false) goto LAB_001570e5;
      pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (((pPVar10 != (Proof *)0x0) &&
          ((ulong)this_00->value <
           (ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2))) &&
         (pCVar21->proof_is_for_hom == false)) {
        gss::innards::Proof::start_level(pPVar10,0);
        pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left,
                   this,(vector<int,_std::allocator<int>_> *)
                        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
        gss::innards::Proof::new_incumbent
                  (pPVar10,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                           &p_left);
        if (p_left._data.short_data[0] != 0) {
          operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
        }
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,local_204);
      }
      Incumbent::update(this_00,c,local_1d0,local_1c8);
    }
    else {
      if ((pCVar21->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)
      goto LAB_0015772b;
      bVar22 = (pCVar21->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
LAB_001570e5:
      if (((bVar22 & 1) != 0) &&
         ((pCVar21->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)) {
LAB_0015772b:
        pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (pPVar10 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,
                    (vector<int,_std::allocator<int>_> *)
                    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start);
          gss::innards::Proof::post_solution(pPVar10,(vector<int,_std::allocator<int>_> *)&p_left);
          if (p_left._data.short_data[0] != 0) {
            operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          }
        }
        return DecidedTrue;
      }
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::operator&=
              (&p_left,(this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    iVar13 = (*((this->params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    local_1d8 = (int *)CONCAT44(local_1d8._4_4_,uVar15 - 1);
    if ((char)iVar13 != '\0') {
      local_1f8 = (ulong)(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
      plVar3 = (this->watches).table.data.
               super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_1f8;
      plVar31 = *(pointer *)
                 &(plVar3->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                  )._M_impl;
LAB_0015720a:
      if (plVar31 != plVar3) {
        sVar6 = (plVar31->
                super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                )._M_impl._M_node._M_size;
        piVar18 = *(int **)(sVar6 + 0x10);
        iVar13 = *piVar18;
        if (iVar13 != (int)local_1f8) {
          *piVar18 = piVar18[1];
          piVar18[1] = iVar13;
        }
        piVar34 = piVar18 + 2;
        if (piVar34 != *(int **)(sVar6 + 0x18)) {
          do {
            piVar18 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            local_f8.short_data[0]._0_4_ = *piVar34;
            _Var17 = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start,piVar18,&local_f8);
            if (_Var17._M_current == piVar18) {
              piVar18 = *(int **)(sVar6 + 0x10);
              iVar13 = *piVar18;
              *piVar18 = *piVar34;
              *piVar34 = iVar13;
              iVar13 = *piVar18;
              plVar7 = (this->watches).table.data.
                       super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              p_Var19 = (_List_node_base *)operator_new(0x18);
              p_Var19[1]._M_next =
                   (_List_node_base *)
                   (plVar31->
                   super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                   )._M_impl._M_node._M_size;
              std::__detail::_List_node_base::_M_hook(p_Var19);
              psVar4 = &plVar7[iVar13].
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar4 = *psVar4 + 1;
              plVar7 = *(pointer *)
                        &(plVar31->
                         super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                         )._M_impl;
              psVar4 = &(plVar3->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        )._M_impl._M_node._M_size;
              *psVar4 = *psVar4 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(plVar31,0x18);
              plVar31 = plVar7;
              goto LAB_0015720a;
            }
            piVar34 = piVar34 + 1;
          } while (piVar34 != *(int **)(sVar6 + 0x18));
          piVar18 = *(int **)(sVar6 + 0x10);
        }
        uVar25 = &p_left;
        if (0x10 < p_left.n_words) {
          uVar25 = p_left._data.short_data[0];
        }
        iVar13 = piVar18[1];
        bVar22 = (byte)iVar13 & 0x3f;
        iVar24 = iVar13 + 0x3f;
        if (-1 < iVar13) {
          iVar24 = iVar13;
        }
        (((SVOBitset *)uVar25)->_data).short_data[iVar24 >> 6] =
             (((SVOBitset *)uVar25)->_data).short_data[iVar24 >> 6] &
             (-2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22);
        plVar31 = *(pointer *)
                   &(plVar31->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                    )._M_impl;
        goto LAB_0015720a;
      }
    }
    uVar15 = (uint)local_1d8;
    pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (pPVar10 != (Proof *)0x0) {
      gss::innards::Proof::start_level(pPVar10,local_204);
    }
    bVar12 = gss::innards::SVOBitset::any(&p_left);
    if (bVar12) {
      SVar14 = expand<false>(this,local_204,nodes,local_1d0,local_1c8,c,&p_left,a + this->size * 2,
                             in_stack_fffffffffffffde8);
      pSVar32 = (SVOBitset *)(ulong)SVar14;
      bVar12 = false;
      if (SVar14 != Aborted) {
        if (SVar14 == Restart) {
          pSVar32 = (SVOBitset *)0x1;
          iVar29._M_current =
               (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish + -1;
          (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar29._M_current;
          uVar27 = (ulong)local_208;
          while( true ) {
            if ((int)uVar27 <= (int)local_200) break;
            uVar27 = (ulong)((int)uVar27 - 1);
            if (iVar29._M_current ==
                (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)c,iVar29,local_1f0 + uVar27);
            }
            else {
              *iVar29._M_current = local_1f0[uVar27];
              (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = iVar29._M_current + 1;
            }
            post_nogood(this,(vector<int,_std::allocator<int>_> *)
                             (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start);
            iVar29._M_current =
                 (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish + -1;
            (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar29._M_current;
          }
          bVar12 = false;
        }
        else {
          bVar12 = false;
          if (SVar14 != DecidedTrue) goto LAB_001573a3;
        }
      }
    }
    else {
LAB_001573a3:
      pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (pPVar10 != (Proof *)0x0) {
        gss::innards::Proof::start_level(pPVar10,depth);
        pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&local_f8,this,
                  (vector<int,_std::allocator<int>_> *)
                  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar10,(vector<int,_std::allocator<int>_> *)&local_f8);
        if ((void *)local_f8.short_data[0] != (void *)0x0) {
          operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
        }
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,local_204);
      }
      ppiVar1 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      pSVar20 = p;
      if (0x10 < p->n_words) {
        pSVar20 = (SVOBitset *)(p->_data).short_data[0];
      }
      pSVar32 = (SVOBitset *)((ulong)unaff_RBP._M_comp.colour_sizes & 0xffffffff);
      bVar12 = true;
      bVar22 = (byte)(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start & 0x3f;
      iVar13 = (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 0x3f;
      if (-1 < (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        iVar13 = (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      (pSVar20->_data).short_data[iVar13 >> 6] =
           (pSVar20->_data).short_data[iVar13 >> 6] &
           (-2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22);
    }
    if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
      operator_delete__(p_left._data.long_data);
    }
    local_200 = local_1e0;
    unaff_RBP._M_comp.colour_sizes = (anon_class_8_1_b323165d)(anon_class_8_1_b323165d)pSVar32;
    if (!bVar12) {
      return (SearchResult)pSVar32;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&p_left,c);
  piVar18 = local_1f0 + (uVar15 - 1);
  do {
    iVar29._M_current =
         (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar29._M_current ==
        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)c,iVar29,piVar18);
    }
    else {
      *iVar29._M_current = *piVar18;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           iVar29._M_current + 1;
    }
    piVar18 = piVar18 + -1;
    uVar15 = (int)local_200 - 1;
    local_200 = (ulong)uVar15;
  } while (0 < (int)uVar15);
  Incumbent::update(this_00,c,local_1d0,local_1c8);
  pCVar21 = this->params;
  pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((pPVar10 != (Proof *)0x0) &&
     ((pCVar21->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
    gss::innards::Proof::start_level(pPVar10,0);
    pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    unpermute_and_finish
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_f8,
               this,(vector<int,_std::allocator<int>_> *)
                    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start);
    gss::innards::Proof::new_incumbent
              (pPVar10,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                       &local_f8);
    if ((void *)local_f8.short_data[0] != (void *)0x0) {
      operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
    }
    gss::innards::Proof::start_level
              ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_204);
    pCVar21 = this->params;
  }
  if ((((pCVar21->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
      ((pCVar21->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)) ||
     (((pCVar21->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true &&
      ((pCVar21->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)))) {
    pPVar10 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    SVar14 = DecidedTrue;
    if (pPVar10 != (Proof *)0x0) {
      unpermute((vector<int,_std::allocator<int>_> *)&local_f8,this,
                (vector<int,_std::allocator<int>_> *)
                (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start);
      gss::innards::Proof::post_solution(pPVar10,(vector<int,_std::allocator<int>_> *)&local_f8);
      if ((void *)local_f8.short_data[0] != (void *)0x0) {
        operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
      }
    }
    bVar12 = false;
  }
  else {
    piVar8 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)p_left._data.short_data[0];
    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         (pointer)p_left._data.short_data[1];
    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)p_left._data.short_data[2];
    p_left._data.short_data[0] = 0;
    p_left._data.short_data[1] = 0;
    p_left._data.short_data[2] = 0;
    if (piVar8 == (pointer)0x0) goto LAB_001577f5;
    operator_delete(piVar8,(long)piVar9 - (long)piVar8);
    bVar12 = true;
  }
  if (p_left._data.short_data[0] != 0) {
    operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
  }
  if (!bVar12) {
    return SVar14;
  }
LAB_001577f5:
  (*((this->params->restarts_schedule)._M_t.
     super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t.
     super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
     super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->_vptr_RestartsSchedule[2])
            ();
  iVar13 = (*((this->params->restarts_schedule)._M_t.
              super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
              .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
             _vptr_RestartsSchedule[4])();
  SVar14 = Complete;
  if ((char)iVar13 != '\0') {
    post_nogood(this,(vector<int,_std::allocator<int>_> *)
                     (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start);
    SVar14 = Restart;
  }
  return SVar14;
code_r0x001569c8:
  lVar26 = lVar26 + -0x40;
  uVar25 = (long)&((SVOBitset *)uVar25)->_data + 8;
  if (uVar27 * 0x40 + lVar26 == 0) goto LAB_001569e2;
  goto LAB_001569c0;
code_r0x00156cd8:
  lVar28 = lVar28 + -0x40;
  uVar25 = (long)&((SVOBitset *)uVar25)->_data + 8;
  if (uVar27 * 0x40 + lVar28 == 0) goto LAB_00156cf2;
  goto LAB_00156cd0;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }